

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCoding.h
# Opt level: O1

void __thiscall
llbuild::basic::BinaryEncoder::write<llbuild::basic::FileTimestamp>
          (BinaryEncoder *this,FileTimestamp *value)

{
  uint64_t uVar1;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  
  uVar1 = value->seconds;
  write(this,(int)uVar1,in_RDX,in_RCX);
  write(this,(int)(uVar1 >> 0x20),__buf,in_RCX);
  uVar1 = value->nanoseconds;
  write(this,(int)uVar1,__buf_00,in_RCX);
  write(this,(int)(uVar1 >> 0x20),__buf_01,in_RCX);
  return;
}

Assistant:

void write(const T& value) {
    BinaryCodingTraits<T>::encode(value, *this);
  }